

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string_const&>
          (Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer __s1;
  size_t __n;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  ulong insertion_idx;
  uint uVar15;
  pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar16;
  
  iVar8 = 0;
  while( true ) {
    sVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    lVar13 = *(long *)(this + 0x20);
    iVar4 = *(int *)(this + 0x40);
    uVar14 = sVar9 * *(long *)(this + 0x10) >> 0x21 ^ sVar9 * *(long *)(this + 0x10);
    insertion_idx = uVar14 >> 5 & *(ulong *)(this + 0x30);
    uVar15 = ((uint)uVar14 & 0x1f) >> ((ulong)(byte)this[0x44] & 0x3f);
    bVar3 = *(byte *)(lVar13 + insertion_idx);
    while( true ) {
      uVar15 = uVar15 + iVar4;
      if (bVar3 <= uVar15) break;
      bVar3 = *(byte *)(lVar13 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar15 == bVar3) {
      lVar11 = *(long *)(this + 0x18);
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      do {
        puVar5 = *(undefined8 **)(lVar11 + insertion_idx * 8);
        if (__n == puVar5[1]) {
          uVar12 = 1;
          if (__n == 0) goto LAB_0012a00e;
          iVar7 = bcmp(__s1,(void *)*puVar5,__n);
          if (iVar7 == 0) {
            uVar12 = 1;
            goto LAB_0012a00e;
          }
        }
        pbVar2 = (byte *)(lVar13 + 1 + insertion_idx);
        uVar15 = uVar15 + iVar4;
        insertion_idx = insertion_idx + 1;
      } while (uVar15 == *pbVar2);
    }
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x38)) break;
    bVar6 = Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::increase_size((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this);
    insertion_idx = 0;
    if (!bVar6) {
      uVar12 = 0;
      goto LAB_0012a00e;
    }
    iVar8 = iVar8 + 1;
    uVar12 = 0;
    if (iVar8 == 0x100) goto LAB_0012a00e;
  }
  if (0xff < iVar4 + uVar15) {
    *(undefined8 *)(this + 0x38) = 0;
  }
  lVar10 = 1;
  lVar11 = lVar13;
  do {
    lVar10 = lVar10 + -1;
    pcVar1 = (char *)(lVar11 + insertion_idx);
    lVar11 = lVar11 + 1;
  } while (*pcVar1 != '\0');
  if (lVar10 == 0) {
    uVar12 = 2;
  }
  else {
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::shiftUp((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,insertion_idx - lVar10,insertion_idx);
    lVar13 = *(long *)(this + 0x20);
    uVar12 = 3;
  }
  *(char *)(lVar13 + insertion_idx) = (char)uVar15;
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
LAB_0012a00e:
  pVar16._8_8_ = uVar12;
  pVar16.first = insertion_idx;
  return pVar16;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }